

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCallback.cpp
# Opt level: O0

void __thiscall HighsCallback::clear(HighsCallback *this)

{
  HighsCallback *in_RDI;
  uint7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  ::operator=((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
               *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),in_RDI);
  in_RDI->user_callback_data = (void *)0x0;
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)(ulong)in_stack_fffffffffffffff0,
             (size_type)in_RDI,(bool *)0x4cd30f);
  clearHighsCallbackDataOut(in_RDI);
  clearHighsCallbackDataIn(in_RDI);
  return;
}

Assistant:

void HighsCallback::clear() {
  this->user_callback = nullptr;
  this->user_callback_data = nullptr;
  this->active.assign(kNumCallbackType, false);
  this->clearHighsCallbackDataOut();
  this->clearHighsCallbackDataIn();
}